

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O0

void Wln_NtkRetimeCreateDelayInfo(Wln_Ntk_t *pNtk)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  uint local_18;
  int local_14;
  int iObj;
  int i;
  Wln_Ntk_t *pNtk_local;
  
  iVar1 = Wln_NtkHasInstId(pNtk);
  if (iVar1 == 0) {
    printf("The design has no delay information.\n");
    Wln_NtkCleanInstId(pNtk);
    for (local_18 = 1; iVar1 = Wln_NtkObjNum(pNtk), (int)local_18 < iVar1; local_18 = local_18 + 1)
    {
      iVar1 = Wln_ObjIsFf(pNtk,local_18);
      if (((iVar1 == 0) && (iVar1 = Wln_ObjType(pNtk,local_18), iVar1 != 0x5b)) &&
         (iVar1 = Wln_ObjType(pNtk,local_18), iVar1 != 0x5c)) {
        iVar1 = Wln_ObjIsCio(pNtk,local_18);
        if ((iVar1 == 0) && (iVar1 = Wln_ObjFaninNum(pNtk,local_18), 0 < iVar1)) {
          Wln_ObjSetInstId(pNtk,local_18,10);
        }
      }
      else {
        Wln_ObjSetInstId(pNtk,local_18,1);
      }
    }
    for (local_14 = 0; iVar1 = Wln_NtkCoNum(pNtk), local_14 < iVar1; local_14 = local_14 + 1) {
      iVar1 = Wln_NtkCo(pNtk,local_14);
      iVar2 = Wln_ObjFanin0(pNtk,iVar1);
      iVar2 = Wln_ObjType(pNtk,iVar2);
      if (iVar2 != 0x4b) {
        iVar1 = Wln_ObjFanin0(pNtk,iVar1);
        Wln_ObjSetInstId(pNtk,iVar1,1);
      }
    }
    printf(
          "Assuming default delays: 10 units for most nodes and 1 unit for bit-slice, concat, and buffers driving COs.\n"
          );
  }
  else {
    printf("Using delays given by the user in the input file.\n");
    for (local_18 = 1; iVar1 = Wln_NtkObjNum(pNtk), (int)local_18 < iVar1; local_18 = local_18 + 1)
    {
      iVar1 = Wln_ObjIsCio(pNtk,local_18);
      if (((iVar1 == 0) && (iVar1 = Wln_ObjIsConst(pNtk,local_18), iVar1 == 0)) &&
         (iVar1 = Wln_ObjInstId(pNtk,local_18), iVar1 == 0)) {
        iVar1 = Wln_ObjType(pNtk,local_18);
        pcVar3 = Abc_OperName(iVar1);
        printf("Warning: Object %d of type %s has zero delay. Retiming will not work correctly.\n",
               (ulong)local_18,pcVar3);
      }
    }
  }
  return;
}

Assistant:

void Wln_NtkRetimeCreateDelayInfo( Wln_Ntk_t * pNtk )
{
    int i, iObj;
//    if ( Wln_NtkHasInstId(pNtk) )
//        Vec_IntErase( &pNtk->vInstIds );
    if ( Wln_NtkHasInstId(pNtk) )
    {
        printf( "Using delays given by the user in the input file.\n" );
        Wln_NtkForEachObj( pNtk, iObj )
            if ( !Wln_ObjIsCio(pNtk, iObj) && !Wln_ObjIsConst(pNtk, iObj) && Wln_ObjInstId(pNtk, iObj) == 0 )
                printf( "Warning: Object %d of type %s has zero delay. Retiming will not work correctly.\n", iObj, Abc_OperName(Wln_ObjType(pNtk, iObj)) );
    }
    else
    {
        printf( "The design has no delay information.\n" );
        Wln_NtkCleanInstId(pNtk);
        Wln_NtkForEachObj( pNtk, iObj )
        {
            if ( Wln_ObjIsFf(pNtk, iObj) || Wln_ObjType(pNtk, iObj) == ABC_OPER_SLICE || Wln_ObjType(pNtk, iObj) == ABC_OPER_CONCAT )
                Wln_ObjSetInstId( pNtk, iObj, 1 );
            else if ( !Wln_ObjIsCio(pNtk, iObj) && Wln_ObjFaninNum(pNtk, iObj) > 0 )
                Wln_ObjSetInstId( pNtk, iObj, 10 );
        }
        Wln_NtkForEachCo( pNtk, iObj, i ) 
        {
            if ( Wln_ObjType(pNtk, Wln_ObjFanin0(pNtk, iObj)) != ABC_OPER_LUT )
                Wln_ObjSetInstId( pNtk, Wln_ObjFanin0(pNtk, iObj), 1 );
        }
        printf( "Assuming default delays: 10 units for most nodes and 1 unit for bit-slice, concat, and buffers driving COs.\n" );
    }
}